

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2NullVsEmptyStringSubmatches(void)

{
  bool bVar1;
  long lVar2;
  StringPiece *x;
  StringPiece matches [4];
  StringPiece empty;
  StringPiece null;
  RE2 re;
  StringPiece local_2f8;
  StringPiece local_2e8;
  StringPiece local_2d8;
  StringPiece local_2c8;
  LogMessage local_2b0;
  StringPiece local_130;
  StringPiece local_120;
  RE2 local_110;
  
  RE2::RE2(&local_110,"()|(foo)");
  if (local_110.error_code_ != NoError) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x597,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: re.ok()",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&local_2f8.ptr_ + lVar2) = 0;
    *(undefined4 *)((long)&local_2f8.length_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    *(char **)((long)&local_2f8.ptr_ + lVar2) = "bar";
    *(undefined4 *)((long)&local_2f8.length_ + lVar2) = 3;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  local_120.ptr_ = (char *)0x0;
  local_120.length_ = 0;
  bVar1 = RE2::Match(&local_110,&local_120,0,0,UNANCHORED,&local_2f8,4);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5a1,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),
               "Check failed: re.Match(null, 0, null.size(), RE2::UNANCHORED, matches, arraysize(matches))"
               ,0x5a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  lVar2 = 0;
  do {
    x = (StringPiece *)((long)&local_2f8.ptr_ + lVar2);
    local_2b0._0_8_ = (char *)0x0;
    local_2b0._8_4_ = 0;
    bVar1 = StringPiece::_equal(x,(StringPiece *)&local_2b0);
    if (!bVar1) {
      LogMessage::LogMessage
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a3,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[i] == NULL",0x20);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
    }
    if (x->ptr_ != (char *)0x0) {
      LogMessage::LogMessage
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a4,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[i].data() == NULL",0x27);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
    }
    local_2b0._0_8_ = "";
    local_2b0._8_4_ = 0;
    bVar1 = StringPiece::_equal(x,(StringPiece *)&local_2b0);
    if (!bVar1) {
      LogMessage::LogMessage
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a5,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[i] == \"\"",0x1e);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    *(char **)((long)&local_2f8.ptr_ + lVar2) = "bar";
    *(undefined4 *)((long)&local_2f8.length_ + lVar2) = 3;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  local_130.ptr_ = "";
  local_130.length_ = 0;
  bVar1 = RE2::Match(&local_110,&local_130,0,0,UNANCHORED,&local_2f8,4);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ad,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),
               "Check failed: re.Match(empty, 0, empty.size(), RE2::UNANCHORED, matches, arraysize(matches))"
               ,0x5c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = (char *)0x0;
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2f8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ae,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[0] == NULL",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  if (local_2f8.ptr_ == (char *)0x0) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5af,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[0].data() != NULL",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = "";
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2f8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b0,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[0] == \"\"",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = (char *)0x0;
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2e8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b1,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[1] == NULL",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  if (local_2e8.ptr_ == (char *)0x0) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b2,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[1].data() != NULL",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = "";
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2e8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[1] == \"\"",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = (char *)0x0;
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2d8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[2] == NULL",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  if (local_2d8.ptr_ != (char *)0x0) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b5,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[2].data() == NULL",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = "";
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2d8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b6,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[2] == \"\"",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = (char *)0x0;
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2c8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[3] == NULL",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  if (local_2c8.ptr_ != (char *)0x0) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b8,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[3].data() == NULL",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  local_2b0._0_8_ = "";
  local_2b0._8_4_ = 0;
  bVar1 = StringPiece::_equal(&local_2c8,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b9,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_2b0 + 8),"Check failed: matches[3] == \"\"",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b0);
  }
  RE2::~RE2(&local_110);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyStringSubmatches) {
  RE2 re("()|(foo)");
  EXPECT_TRUE(re.ok());

  // matches[0] is overall match, [1] is (), [2] is (foo), [3] is nonexistent.
  StringPiece matches[4];

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece null;
  EXPECT_TRUE(re.Match(null, 0, null.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  for (int i = 0; i < arraysize(matches); i++) {
    EXPECT_TRUE(matches[i] == NULL);
    EXPECT_TRUE(matches[i].data() == NULL);  // always null
    EXPECT_TRUE(matches[i] == "");
  }

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece empty("");
  EXPECT_TRUE(re.Match(empty, 0, empty.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  EXPECT_TRUE(matches[0] == NULL);
  EXPECT_TRUE(matches[0].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[0] == "");
  EXPECT_TRUE(matches[1] == NULL);
  EXPECT_TRUE(matches[1].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[1] == "");
  EXPECT_TRUE(matches[2] == NULL);
  EXPECT_TRUE(matches[2].data() == NULL);
  EXPECT_TRUE(matches[2] == "");
  EXPECT_TRUE(matches[3] == NULL);
  EXPECT_TRUE(matches[3].data() == NULL);
  EXPECT_TRUE(matches[3] == "");
}